

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mipsdsp_multiply
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *tcg_ctx;
  undefined8 uVar1;
  TCGv_i32 ret_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  undefined4 in_register_00000014;
  TCGTemp *ret_01;
  int iVar2;
  code *func;
  uintptr_t o_52;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *local_68;
  TCGv_i64 local_60;
  TCGv_ptr local_58;
  TCGv_ptr local_50;
  int local_40;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,op2);
  if (check_ret == 1 && ret == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  local_40 = v1;
  local_3c = v2;
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  uVar1 = local_38;
  tcg_gen_movi_i32(tcg_ctx,ret_00,ret);
  gen_load_gpr(tcg_ctx,t,local_40);
  gen_load_gpr(tcg_ctx,t_00,local_3c);
  iVar2 = (int)uVar1;
  switch(op1 << 0x1e | op1 + 0x83fffff0 >> 2) {
  case 0:
    if (iVar2 == 0x7c0007d0) {
      check_dsp(ctx);
      gen_helper_mulq_rs_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c0001d0) {
      check_dsp(ctx);
      gen_helper_muleu_s_ph_qbr(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000710) {
      check_dsp(ctx);
      gen_helper_muleq_s_w_phl(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000750) {
      check_dsp(ctx);
      gen_helper_muleq_s_w_phr(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000790) {
      check_dsp_r2(ctx);
      gen_helper_mulq_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000190) {
      check_dsp(ctx);
      gen_helper_muleu_s_ph_qbl(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    break;
  case 1:
    if (iVar2 == 0x7c000194) {
      check_dsp(ctx);
      local_58 = tcg_ctx->cpu_env + (long)tcg_ctx;
      ret_01 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      func = helper_muleu_s_qh_obl_mips64el;
    }
    else if (iVar2 == 0x7c0001d4) {
      check_dsp(ctx);
      local_58 = tcg_ctx->cpu_env + (long)tcg_ctx;
      ret_01 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      func = helper_muleu_s_qh_obr_mips64el;
    }
    else if (iVar2 == 0x7c0007d4) {
      check_dsp(ctx);
      local_58 = tcg_ctx->cpu_env + (long)tcg_ctx;
      ret_01 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      func = helper_mulq_rs_qh_mips64el;
    }
    else if (iVar2 == 0x7c000754) {
      check_dsp(ctx);
      local_58 = tcg_ctx->cpu_env + (long)tcg_ctx;
      ret_01 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      func = helper_muleq_s_pw_qhr_mips64el;
    }
    else {
      if (iVar2 != 0x7c000714) break;
      check_dsp(ctx);
      local_58 = tcg_ctx->cpu_env + (long)tcg_ctx;
      ret_01 = (TCGTemp *)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[(uint)ret]);
      func = helper_muleq_s_pw_qhl_mips64el;
    }
    iVar2 = 3;
    goto LAB_0088e288;
  case 2:
    check_dsp_r2(ctx);
    if (iVar2 == 0x7c0005d8) {
      gen_helper_mulq_rs_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000398) {
      gen_helper_mul_s_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000598) {
      gen_helper_mulq_s_w(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    else if (iVar2 == 0x7c000318) {
      gen_helper_mul_ph(tcg_ctx,tcg_ctx->cpu_gpr[(uint)ret],t,t_00,tcg_ctx->cpu_env);
    }
    break;
  case 8:
    switch((iVar2 + 0x83ffffd0U) * 0x4000000 | iVar2 + 0x83ffffd0U >> 6) {
    case 0:
      check_dsp_r2(ctx);
      gen_helper_dpa_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 1:
      check_dsp_r2(ctx);
      gen_helper_dps_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 2:
      check_dsp_r2(ctx);
      gen_helper_mulsa_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 3:
      check_dsp(ctx);
      gen_helper_dpau_h_qbl(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 4:
      check_dsp(ctx);
      gen_helper_dpaq_s_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 5:
      check_dsp(ctx);
      gen_helper_dpsq_s_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 6:
      check_dsp(ctx);
      gen_helper_mulsaq_s_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 7:
      check_dsp(ctx);
      gen_helper_dpau_h_qbr(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 8:
      check_dsp_r2(ctx);
      gen_helper_dpax_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 9:
      check_dsp_r2(ctx);
      gen_helper_dpsx_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xb:
      check_dsp(ctx);
      gen_helper_dpsu_h_qbl(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xc:
      check_dsp(ctx);
      gen_helper_dpaq_sa_l_w(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xd:
      check_dsp(ctx);
      gen_helper_dpsq_sa_l_w(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0xf:
      check_dsp(ctx);
      gen_helper_dpsu_h_qbr(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x10:
      check_dsp(ctx);
      gen_helper_maq_sa_w_phl(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x12:
      check_dsp(ctx);
      gen_helper_maq_sa_w_phr(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x14:
      check_dsp(ctx);
      gen_helper_maq_s_w_phl(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x16:
      check_dsp(ctx);
      gen_helper_maq_s_w_phr(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x18:
      check_dsp_r2(ctx);
      gen_helper_dpaqx_s_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x19:
      check_dsp_r2(ctx);
      gen_helper_dpsqx_s_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x1a:
      check_dsp_r2(ctx);
      gen_helper_dpaqx_sa_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
      break;
    case 0x1b:
      check_dsp_r2(ctx);
      gen_helper_dpsqx_sa_w_ph(tcg_ctx,ret_00,t,t_00,tcg_ctx->cpu_env);
    }
    break;
  case 9:
    tcg_gen_movi_i32(tcg_ctx,ret_00,ret & 3);
    switch((iVar2 + 0x83ffffccU) * 0x4000000 | iVar2 + 0x83ffffccU >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpa_w_qh_mips64el;
      break;
    case 1:
      check_dsp_r2(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dps_w_qh_mips64el;
      break;
    default:
      goto switchD_0088d4b9_caseD_3;
    case 3:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpau_h_obl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpaq_s_w_qh_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpsq_s_w_qh_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_mulsaq_s_w_qh_mips64el;
      break;
    case 7:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpau_h_obr_mips64el;
      break;
    case 0xb:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpsu_h_obl_mips64el;
      break;
    case 0xc:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpaq_sa_l_pw_mips64el;
      break;
    case 0xd:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpsq_sa_l_pw_mips64el;
      break;
    case 0xe:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_mulsaq_s_l_pw_mips64el;
      break;
    case 0xf:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dpsu_h_obr_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_sa_w_qhll_mips64el;
      break;
    case 0x11:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_sa_w_qhlr_mips64el;
      break;
    case 0x12:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_sa_w_qhrl_mips64el;
      break;
    case 0x13:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_sa_w_qhrr_mips64el;
      break;
    case 0x14:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_w_qhll_mips64el;
      break;
    case 0x15:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_w_qhlr_mips64el;
      break;
    case 0x16:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_w_qhrl_mips64el;
      break;
    case 0x17:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_w_qhrr_mips64el;
      break;
    case 0x19:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dmadd_mips64el;
      break;
    case 0x1b:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dmsub_mips64el;
      break;
    case 0x1c:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_l_pwl_mips64el;
      break;
    case 0x1d:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dmaddu_mips64el;
      break;
    case 0x1e:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_maq_s_l_pwr_mips64el;
      break;
    case 0x1f:
      check_dsp(ctx);
      local_50 = tcg_ctx->cpu_env + (long)tcg_ctx;
      func = helper_dmsubu_mips64el;
    }
    local_58 = (TCGv_ptr)(ret_00 + (long)&tcg_ctx->pool_cur);
    iVar2 = 4;
    ret_01 = (TCGTemp *)0x0;
LAB_0088e288:
    local_60 = t_00 + (long)&tcg_ctx->pool_cur;
    local_68 = (TCGTemp *)(t + (long)&tcg_ctx->pool_cur);
    tcg_gen_callN_mips64el(tcg_ctx,func,ret_01,iVar2,&local_68);
  }
switchD_0088d4b9_caseD_3:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mipsdsp_multiply(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                 int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new_i32(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_i32(tcg_ctx, t0, ret);
    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /*
     * OPC_MULT_G_2E, OPC_ADDUH_QB_DSP, OPC_MUL_PH_DSP have
     * the same mask and op1.
     */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case  OPC_MUL_PH:
            gen_helper_mul_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case  OPC_MUL_S_PH:
            gen_helper_mul_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_W:
            gen_helper_mulq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_W:
            gen_helper_mulq_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_DPA_W_PH_DSP:
        switch (op2) {
        case OPC_DPAU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpau_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpau_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpax_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPS_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dps_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsx_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpsq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_mulsaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpaq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpsq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_s_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_s_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_mulsa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DPAQ_W_QH_DSP:
        {
            int ac = ret & 0x03;
            tcg_gen_movi_i32(tcg_ctx, t0, ac);

            switch (op2) {
            case OPC_DMADD:
                check_dsp(ctx);
                gen_helper_dmadd(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMADDU:
                check_dsp(ctx);
                gen_helper_dmaddu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUB:
                check_dsp(ctx);
                gen_helper_dmsub(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUBU:
                check_dsp(ctx);
                gen_helper_dmsubu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPA_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dpa_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpaq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpau_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpau_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPS_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dps_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpsq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpsq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpsu_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpsu_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWL:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWR:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_L_PW:
                check_dsp(ctx);
                gen_helper_mulsaq_s_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_mulsaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            }
        }
        break;
#endif
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_MULEU_S_PH_QBL:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_PH_QBR:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_PH:
            check_dsp(ctx);
            gen_helper_mulq_rs_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_PH:
            check_dsp_r2(ctx);
            gen_helper_mulq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_MULEQ_S_PW_QHL:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_PW_QHR:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBL:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBR:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_QH:
            check_dsp(ctx);
            gen_helper_mulq_rs_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}